

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  StringRef path_00;
  StringRef SVar1;
  void *pvVar2;
  bool bVar3;
  reference pSVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  Style in_R8D;
  long lVar6;
  StringRef SVar7;
  StringRef path_01;
  StringRef C;
  StringRef C_1;
  SmallString<256U> result;
  SmallVector<llvm::StringRef,_16U> components;
  StringRef local_2d8;
  Child local_2c8;
  size_t sStack_2c0;
  StringRef local_2a8;
  Twine local_298;
  Twine local_280;
  Twine local_268;
  undefined1 local_250 [24];
  size_t sStack_238;
  size_t local_230;
  SmallVectorTemplateCommon<llvm::StringRef,_void> local_140;
  undefined1 local_130 [256];
  
  SVar7.Length._4_4_ = in_register_00000014;
  SVar7.Length._0_4_ = style;
  local_2d8.Data =
       (char *)(path->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  SVar7.Data = (char *)(ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
  ;
  local_140.super_SmallVectorBase.BeginX = local_130;
  local_140.super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorBase.Capacity = 0x10;
  local_2d8.Length = (size_t)SVar7.Data;
  SVar7 = relative_path((path *)local_2d8.Data,SVar7,windows);
  path_01.Data = SVar7.Length;
  path_01.Length._0_4_ = style;
  path_01.Length._4_4_ = 0;
  begin((const_iterator *)local_250,(path *)SVar7.Data,path_01,in_R8D);
  do {
    SVar1.Length = local_230;
    SVar1.Data = (char *)local_250._0_8_;
    if (SVar7 == SVar1) {
      path_00.Length = local_2d8.Length;
      path_00.Data = local_2d8.Data;
      SVar7 = root_path(path_00,style);
      SmallVector<char,256u>::SmallVector<char_const*,void>
                ((SmallVector<char,_256U> *)local_250,SVar7.Data,SVar7.Data + SVar7.Length);
      pvVar2 = local_140.super_SmallVectorBase.BeginX;
      uVar5 = local_140.super_SmallVectorBase._8_8_ & 0xffffffff;
      for (lVar6 = 0; uVar5 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
        local_2a8.Data = *(char **)((long)pvVar2 + lVar6);
        local_2a8.Length = ((undefined8 *)((long)pvVar2 + lVar6))[1];
        Twine::Twine(&local_298,&local_2a8);
        Twine::Twine((Twine *)&local_2c8,"");
        Twine::Twine(&local_268,"");
        Twine::Twine(&local_280,"");
        append((SmallVectorImpl<char> *)local_250,style,&local_298,(Twine *)&local_2c8,&local_268,
               &local_280);
      }
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                ((SmallVectorImpl<llvm::StringRef> *)&local_140);
      bVar3 = SmallVectorImpl<char>::operator==((SmallVectorImpl<char> *)local_250,path);
      if (!bVar3) {
        SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_250);
      }
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_250);
      return !bVar3;
    }
    local_2c8.cString = (char *)local_250._16_8_;
    sStack_2c0 = sStack_238;
    if (sStack_238 == 1) {
      if (*(char *)local_250._16_8_ == '.') goto LAB_0014bd30;
LAB_0014bd23:
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&local_140,
                 (StringRef *)&local_2c8);
    }
    else {
      if ((sStack_238 != 2 || !remove_dot_dot) || (*(short *)local_250._16_8_ != 0x2e2e))
      goto LAB_0014bd23;
      if ((local_140.super_SmallVectorBase.Size == 0) ||
         ((pSVar4 = SmallVectorTemplateCommon<llvm::StringRef,_void>::back(&local_140),
          pSVar4->Length == 2 && (*(short *)pSVar4->Data == 0x2e2e)))) {
        Twine::Twine(&local_298,&local_2d8);
        bVar3 = is_absolute(&local_298,style);
        if (!bVar3) goto LAB_0014bd23;
      }
      else {
        SmallVectorTemplateBase<llvm::StringRef,_true>::pop_back
                  ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&local_140);
      }
    }
LAB_0014bd30:
    const_iterator::operator++((const_iterator *)local_250);
  } while( true );
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}